

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  undefined8 *puVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int i;
  int index;
  char *pcVar6;
  char *in_R9;
  internal iVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  TypeParam ht_in;
  TypeParam ht_out;
  stringstream string_buffer;
  key_equal local_2f0;
  undefined1 local_2e0 [8];
  undefined8 local_2d8;
  AssertHelper local_2d0;
  string local_2c8;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2a8;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_228;
  pair<google::dense_hashtable_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_1a8 [4];
  ios_base local_128 [264];
  
  local_2a8.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)0x0;
  local_2a8.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = 0;
  local_2c8._M_dataplus._M_p = (pointer)0x0;
  local_2c8._M_string_length = local_2c8._M_string_length & 0xffffffff00000000;
  local_1a8[0].first.ht._0_4_ = 0;
  local_1a8[0].first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_228,0,(hasher *)&local_2a8,(key_equal *)&local_2c8,(allocator_type *)local_1a8);
  iVar5 = UniqueObjectHelper<int>(2000);
  pdVar1 = &local_228.
            super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&pdVar1->rep);
  local_228.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = true;
  index = 1;
  local_228.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = iVar5;
  do {
    iVar5 = UniqueObjectHelper<int>(index);
    local_2a8.
    super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ._vptr_BaseHashtableInterface =
         (_func_int **)
         CONCAT44(local_2a8.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ._vptr_BaseHashtableInterface._4_4_,iVar5);
    google::
    dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&pdVar1->rep,1);
    google::
    dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              (local_1a8,
               (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)pdVar1,(int *)&local_2a8,(int *)&local_2a8);
    index = index + 1;
  } while (index != 100);
  local_1a8[0].first.ht._0_4_ = UniqueObjectHelper<int>(0x38);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&pdVar1->rep,(key_type *)local_1a8);
  local_1a8[0].first.ht._0_4_ = UniqueObjectHelper<int>(0x16);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&pdVar1->rep,(key_type *)local_1a8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  bVar4 = google::
          dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    ((dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)pdVar1);
  local_2c8._M_dataplus._M_p._0_1_ = bVar4;
  local_2c8._M_string_length = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_2a8,(internal *)&local_2c8,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &string_buffer)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x527,(char *)local_2a8.
                              super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ._vptr_BaseHashtableInterface);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2a8.
        super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ._vptr_BaseHashtableInterface !=
        (_func_int **)
        ((long)&local_2a8.
                super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.settings.
                super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> + 8U)) {
      operator_delete(local_2a8.
                      super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ._vptr_BaseHashtableInterface);
    }
    if (local_2e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2e0 + 8))();
    }
    sVar3 = local_2c8._M_string_length;
    if ((undefined8 *)local_2c8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2c8._M_string_length !=
          (undefined8 *)(local_2c8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2c8._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
  }
  local_2e0 = (undefined1  [8])0x0;
  local_2d8 = (undefined8 *)((ulong)local_2d8._4_4_ << 0x20);
  local_2f0.super_Hasher._0_8_ = (AssertHelperData *)0x0;
  local_2f0.super_Hasher.num_compares_ = 0;
  local_2c8._M_dataplus._M_p = local_2c8._M_dataplus._M_p & 0xffffffff00000000;
  local_2c8._M_string_length = 0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_2a8,0,(hasher *)local_2e0,&local_2f0,(allocator_type *)&local_2c8);
  pdVar1 = &local_2a8.
            super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  bVar4 = google::
          dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                    ((dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)pdVar1,local_1a8);
  local_2e0[0] = (internal)bVar4;
  local_2d8 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_2e0,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &string_buffer)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52b,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_2f0.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.super_Hasher._0_8_ + 8))();
    }
    puVar2 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar2);
    }
  }
  iVar5 = UniqueObjectHelper<int>(1);
  local_2f0.super_Hasher.id_ = iVar5;
  local_2d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)&local_2c8,&pdVar1->rep,(int *)&local_2d0);
  local_2c8.field_2._8_8_ = &local_2a8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (int *)&local_2f0,(int *)local_2c8._M_string_length);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c8);
    if (local_2d8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if ((long *)local_2c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c8._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(99);
  local_2f0.super_Hasher.id_ = iVar5;
  local_2d0.data_._0_4_ = UniqueObjectHelper<int>(99);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)&local_2c8,&pdVar1->rep,(int *)&local_2d0);
  local_2c8.field_2._8_8_ = &local_2a8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (int *)&local_2f0,(int *)local_2c8._M_string_length);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c8);
    if (local_2d8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if ((long *)local_2c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c8._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(100);
  local_2c8._M_dataplus._M_p._0_4_ = iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&pdVar1->rep,(int *)&local_2c8);
  bVar4 = pVar8.first == 0xffffffffffffffff;
  local_2e0[0] = (internal)bVar4;
  local_2d8 = (undefined8 *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_2e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52f,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_2f0.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.super_Hasher._0_8_ + 8))();
    }
    puVar2 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar2);
    }
  }
  iVar5 = UniqueObjectHelper<int>(0x15);
  local_2f0.super_Hasher.id_ = iVar5;
  local_2d0.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((const_iterator *)&local_2c8,&pdVar1->rep,(int *)&local_2d0);
  local_2c8.field_2._8_8_ = &local_2a8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_2e0,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (int *)&local_2f0,(int *)local_2c8._M_string_length);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c8);
    if (local_2d8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x530,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if ((long *)local_2c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2c8._M_dataplus._M_p + 8))();
    }
  }
  puVar2 = local_2d8;
  if (local_2d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
      operator_delete((undefined8 *)*local_2d8);
    }
    operator_delete(puVar2);
  }
  iVar5 = UniqueObjectHelper<int>(0x16);
  local_2c8._M_dataplus._M_p._0_4_ = iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&pdVar1->rep,(int *)&local_2c8);
  iVar7 = (internal)(pVar8.first == 0xffffffffffffffff);
  local_2d8 = (undefined8 *)0x0;
  local_2e0[0] = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_2e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x532,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_2f0.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.super_Hasher._0_8_ + 8))();
    }
    puVar2 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar2);
    }
  }
  iVar5 = UniqueObjectHelper<int>(0x38);
  local_2c8._M_dataplus._M_p._0_4_ = iVar5;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&pdVar1->rep,(int *)&local_2c8);
  local_2e0[0] = (internal)(pVar8.first == 0xffffffffffffffff);
  local_2d8 = (undefined8 *)0x0;
  if (!(bool)local_2e0[0]) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_2e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x533,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_2f0.super_Hasher._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f0.super_Hasher._0_8_ + 8))();
    }
    puVar2 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar2);
    }
  }
  local_2a8.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c17378;
  if (local_2a8.
      super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_2a8.
         super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  local_228.
  super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c17378;
  if (local_228.
      super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_228.
         super_BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}